

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O3

void __thiscall
clunk::Node::GetSliderDiscovers(Node *this,Color color,MoveType type,uint64_t mvs,int from)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uint32_t uVar6;
  byte *pbVar7;
  bool bVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  uint to;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  
  if (this->checks != 0) {
    __assert_fail("!checks",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6f9,
                  "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6fa,
                  "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  uVar10 = (ulong)(uint)from;
  pbVar7 = (byte *)(&_board)[uVar10];
  if (pbVar7 == _EMPTY) {
    __assert_fail("_board[from] != _EMPTY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6fb,
                  "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  if ((color | type) != (uint)*pbVar7) {
    __assert_fail("_board[from]->type == (color|type)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6fc,
                  "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  if ((uint)pbVar7[1] != from) {
    __assert_fail("_board[from]->sqr == from",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6fd,
                  "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  iVar9 = GetPinDir(this,color,from);
  if (mvs != 0) {
    do {
      if ((mvs & 0xff) == 0) {
        __assert_fail("mvs & 0xFF",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x700,
                      "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                     );
      }
      uVar16 = (int)(mvs & 0xff) - 1;
      if ((uVar16 & 0xffffff88) != 0) {
        __assert_fail("IS_SQUARE(to)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x107,"int clunk::Direction(const int, const int)");
      }
      bVar1 = (&_dir)[(ulong)uVar16 + uVar10 * 0x80];
      if (((0x11 < bVar1) || ((0x38002U >> (bVar1 & 0x1f) & 1) == 0)) &&
         ((0x10 < bVar1 - 0xef || ((0x10007U >> (bVar1 - 0xef & 0x1f) & 1) == 0)))) {
        __assert_fail("IS_DIR(dir)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x703,
                      "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                     );
      }
      iVar12 = (int)(char)bVar1;
      iVar13 = -iVar12;
      if (0 < iVar12) {
        iVar13 = iVar12;
      }
      if ((iVar9 == 0) || (iVar13 == iVar9)) {
        to = from + iVar12;
        if ((to & 0xffffff88) != 0) {
LAB_00130876:
          __assert_fail("IS_SQUARE(to)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x706,
                        "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                       );
        }
        uVar15 = from + iVar12 * 2;
        while( true ) {
          uVar14 = (ulong)to;
          if ((&_dir)[uVar14 + uVar10 * 0x80] != bVar1) {
            __assert_fail("Direction(from, to) == dir",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x707,
                          "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                         );
          }
          cVar2 = *(char *)(&_board)[uVar14];
          if ((cVar2 == '\0') && ((char *)(&_board)[uVar14] != _EMPTY)) {
            __assert_fail("cap || (_board[to] == _EMPTY)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x709,
                          "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                         );
          }
          if (cVar2 != '\0') break;
          bVar3 = _kingDir[(uint)!color * 8 + to];
          if (type == BishopMove) {
            if (bVar3 < 0xef) {
              if ((bVar3 != 0xf) && (bVar3 != 0x11)) {
LAB_00130797:
                uVar4 = this->moveCount;
                lVar11 = (long)(int)uVar4;
                if (lVar11 < 0) {
                  __assert_fail("moveCount >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                                ,0x60d,
                                "void clunk::Node::AddMove(const MoveType, const int, const int, const int, const int, const int)"
                               );
                }
                if (0x7e < uVar4) {
                  __assert_fail("(moveCount + 1) < MaxMoves",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                                ,0x60e,
                                "void clunk::Node::AddMove(const MoveType, const int, const int, const int, const int, const int)"
                               );
                }
                iVar13 = *(int *)(_SQR + uVar14 * 4);
                iVar5 = *(int *)(_SQR + uVar10 * 4);
                this->moveCount = uVar4 + 1;
                Move::Set(this->moves + lVar11,type,from,to,0,0,(iVar13 - iVar5) + 10);
                uVar6 = this->moves[lVar11].bits;
                iVar13 = 0x32;
                if (uVar6 != this->killer[1].bits) {
                  iVar13 = 0;
                }
                if (uVar6 == this->killer[0].bits) {
                  iVar13 = 0x32;
                }
                Move::IncScore(this->moves + lVar11,iVar13);
              }
            }
            else if ((bVar3 != 0xef) && (bVar3 != 0xf1)) goto LAB_00130797;
          }
          else if (bVar3 < 0xf0) {
            if ((bVar3 != 1) && (bVar3 != 0x10)) goto LAB_00130797;
          }
          else if ((bVar3 != 0xf0) && (bVar3 != 0xff)) goto LAB_00130797;
          if (uVar16 == to) break;
          to = to + iVar12;
          uVar4 = uVar15 & 0xffffff88;
          uVar15 = uVar15 + iVar12;
          if (uVar4 != 0) goto LAB_00130876;
        }
      }
      bVar8 = 0xff < mvs;
      mvs = mvs >> 8;
    } while (bVar8);
  }
  return;
}

Assistant:

void GetSliderDiscovers(const Color color, const MoveType type,
                          uint64_t mvs, const int from)
  {
    assert(!checks);
    assert(IS_SQUARE(from));
    assert(_board[from] != _EMPTY);
    assert(_board[from]->type == (color|type));
    assert(_board[from]->sqr == from);
    const int pinDir = GetPinDir(color, from);
    while (mvs) {
      assert(mvs & 0xFF);
      const int end = ((mvs & 0xFF) - 1);
      const int dir = (Direction(from, end));
      assert(IS_DIR(dir));
      if (!pinDir || (abs(dir) == pinDir)) {
        for (int to = (from + dir);; to += dir) {
          assert(IS_SQUARE(to));
          assert(Direction(from, to) == dir);
          const int cap = _board[to]->type;
          assert(cap || (_board[to] == _EMPTY));
          if (!cap) {
            if ((type == BishopMove) ? !IS_DIAG(_kingDir[to + (8 * !color)])
                                     : !IS_CROSS(_kingDir[to + (8 * !color)]))
            {
              const int score = (_SQR[to] - _SQR[from] + 10);
              AddMove(type, from, to, score);
            }
          }
          else {
            break;
          }
          if (to == end) {
            break;
          }
        }
      }
      mvs >>= 8;
    }
  }